

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_TestShell::
~TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_TestShell
          (TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_TestShell *this)

{
  TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_TestShell *mem;
  TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_TestShell *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_NoPointsHand_ScoringWindPair_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, NoPointsHand_ScoringWindPair)
{
	s.setRoundWind(Tile::EastWind);

	addPair(Tile::EastWind);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::NoPointsHand));
}